

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BST.hpp
# Opt level: O1

unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>_>_>
 __thiscall
supermap::BST<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>::createLikeThis
          (BST<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long> *this)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)operator_new(0x40);
  *pp_Var1 = (_func_int *)0x0;
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  pp_Var1[5] = (_func_int *)0x0;
  pp_Var1[6] = (_func_int *)0x0;
  pp_Var1[7] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)&PTR_add_002075f8;
  pp_Var1[1] = (_func_int *)&DAT_00207648;
  *(undefined4 *)(pp_Var1 + 3) = 0;
  pp_Var1[4] = (_func_int *)0x0;
  pp_Var1[5] = (_func_int *)(pp_Var1 + 3);
  pp_Var1[6] = (_func_int *)(pp_Var1 + 3);
  pp_Var1[7] = (_func_int *)0x0;
  (this->
  super_ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>).
  super_KeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>.
  _vptr_KeyValueStorage = pp_Var1;
  return (__uniq_ptr_data<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>_>,_true,_true>
          )(__uniq_ptr_data<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ExtractibleKeyValueStorage<Key, Value, IndexT>> createLikeThis() const override {
        return std::make_unique<BST<Key, Value, IndexT>>();
    }